

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O1

int mattacku(monst *mtmp)

{
  int *piVar1;
  schar sVar2;
  byte bVar3;
  uchar uVar4;
  permonst *ppVar5;
  bool bVar6;
  monst *pmVar7;
  boolean bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  obj *poVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  int tmp;
  long lVar17;
  char cVar18;
  undefined4 uVar19;
  undefined8 unaff_R12;
  attack *mattk;
  byte bVar20;
  int iVar21;
  char cVar22;
  undefined8 unaff_R15;
  undefined8 uVar23;
  ulong uVar24;
  attack alt_attk;
  int sum [6];
  musable musable;
  int local_27c;
  permonst *local_278;
  attack local_26c;
  char *local_268;
  uint local_25c;
  uint local_258;
  uint local_254;
  d_level *local_250;
  d_level *local_248;
  undefined8 local_240;
  int local_238 [2];
  undefined1 local_230;
  musable local_138 [6];
  
  local_278 = mtmp->data;
  iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  bVar8 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
  uVar19 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar8 == '\0');
  if (mtmp->mux == u.ux) {
    uVar23 = CONCAT71((int7)((ulong)unaff_R15 >> 8),mtmp->muy == u.uy);
  }
  else {
    uVar23 = 0;
  }
  uVar12 = (uint)uVar23;
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((bVar20 = 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (bVar20 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((bVar20 = 1, (viz_array[mtmp->my][mtmp->mx] & 1U) != 0 &&
         ((mtmp->data->mflags3 & 0x200) != 0)))))) goto LAB_001cb5a4;
  }
  else {
    bVar8 = worm_known(level,mtmp);
    if (bVar8 == '\0') {
      bVar20 = 1;
    }
    else {
LAB_001cb5a4:
      uVar11 = *(uint *)&mtmp->field_0x60;
      if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar20 = 1;
        if (-1 < (char)uVar11) goto LAB_001cb5e4;
      }
      else {
        bVar20 = 1;
        if ((-1 < (char)uVar11) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001cb5e4:
          bVar20 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar11 >> 9) & 1;
        }
      }
    }
  }
  if (iVar9 < 4) {
    nomul(0,(char *)0x0);
  }
  pmVar7 = u.ustuck;
  if (mtmp->mhp < 1) {
    return 0;
  }
  if (((u._1052_1_ & 2) != 0) && ((mtmp->data->mflags1 & 2) == 0)) {
    return 0;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (u.usteed != (monst *)0x0) {
      if (u.usteed == mtmp) {
        return 0;
      }
      uVar11 = mtmp->data->mflags2;
      uVar10 = mt_random();
      if ((((uint)(-1 < (char)uVar11) * 2 + 1 & uVar10) == 0) &&
         (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar9 < 3)) {
        uVar12 = mattackm(mtmp,u.usteed);
        if ((uVar12 & 4) != 0) {
          return 1;
        }
        if ((uVar12 & 2) != 0) {
          return 0;
        }
        if (u.umoved == '\0') {
          uVar12 = mattackm(u.usteed,mtmp);
          return uVar12 >> 1 & 1;
        }
        return 0;
      }
    }
  }
  else {
    if (u.ustuck != mtmp) {
      return 0;
    }
    (u.ustuck)->mux = u.ux;
    pmVar7->muy = u.uy;
    if ((u._1052_1_ & 0x10) != 0) {
      return 0;
    }
    uVar12 = (uint)CONCAT71((int7)((ulong)uVar23 >> 8),1);
    uVar19 = 0;
  }
  cVar18 = (char)uVar19;
  cVar22 = (char)uVar12;
  if (((((u._1052_1_ & 1) == 0) && ((u._1052_1_ & 4) != 0)) && (cVar18 == '\0')) && (cVar22 != '\0')
     ) {
    u._1052_1_ = u._1052_1_ & 0xfa;
    if (((youmonst.data)->mflags1 & 0x100) != 0) {
      pcVar14 = ceiling((int)u.ux,(int)u.uy);
      pline("You fall from the %s!",pcVar14);
      bVar8 = enexto((coord *)local_138,level,u.ux,u.uy,youmonst.data);
      if (bVar8 == '\0') {
        pcVar14 = Monnam(mtmp);
        pcVar15 = mons_mname(youmonst.data);
        bVar6 = false;
        pline("%s is killed by a falling %s (you)!",pcVar14,pcVar15);
        killed(mtmp);
        newsym((int)u.ux,(int)u.uy);
        uVar12 = (uint)(mtmp->mhp < 1);
      }
      else {
        remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
        newsym((int)mtmp->mx,(int)mtmp->my);
        place_monster(mtmp,(int)u.ux,(int)u.uy);
        if (mtmp->wormno != '\0') {
          worm_move(mtmp);
        }
        teleds((int)(char)local_138[0].offensive,(int)local_138[0].offensive._1_1_,'\x01');
        set_apparxy(level,mtmp);
        newsym((int)u.ux,(int)u.uy);
        bVar6 = false;
        uVar12 = 0;
        if ((youmonst.data)->mlet == '\x10') {
          poVar13 = which_armor(mtmp,4);
          if ((poVar13 == (obj *)0x0) ||
             (6 < (ushort)((*(ushort *)&objects[poVar13->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
            iVar9 = find_mac(mtmp);
            uVar11 = mt_random();
            pcVar14 = Monnam(mtmp);
            if (iVar9 + 2 <= (int)(uVar11 % 0x14)) {
              pline("%s is hit by a falling piercer (you)!",pcVar14);
              iVar9 = 3;
              iVar21 = -3;
              do {
                uVar11 = mt_random();
                iVar9 = iVar9 + uVar11 % 6;
                iVar21 = iVar21 + 1;
              } while (iVar21 != 0);
              piVar1 = &mtmp->mhp;
              iVar21 = *piVar1;
              *piVar1 = *piVar1 - iVar9;
              bVar6 = true;
              if (*piVar1 == 0 || SBORROW4(iVar21,iVar9) != *piVar1 < 0) {
                killed(mtmp);
              }
              goto LAB_001cbdeb;
            }
            pcVar15 = "%s is almost hit by a falling piercer (you)!";
          }
          else {
            pcVar14 = mon_nam(mtmp);
            pcVar14 = s_suffix(pcVar14);
            pcVar15 = "Your blow glances off %s helmet.";
          }
          pline(pcVar15,pcVar14);
          bVar6 = true;
        }
      }
LAB_001cbdeb:
      if (bVar6) {
        return 0;
      }
      return uVar12;
    }
    if (bVar20 == 0) {
      poVar13 = level->objects[u.ux][u.uy];
      if (poVar13 == (obj *)0x0) {
        if (((youmonst.data)->mlet != '9') ||
           (bVar8 = is_pool(level,(int)u.ux,(int)u.uy), bVar8 == '\0')) {
          warning("hiding under nothing?");
          goto LAB_001cbb6f;
        }
        sVar2 = '\0';
      }
      else {
        sVar2 = poVar13->spe;
        if (poVar13->otyp == 0x10f) {
          poVar13->spe = '\0';
        }
      }
      cVar18 = (youmonst.data)->mlet;
      pcVar14 = m_monnam(mtmp);
      pcVar15 = mons_mname(youmonst.data);
      if (cVar18 == '9') {
        pline("Wait, %s!  There\'s a hidden %s named %s there!",pcVar14,pcVar15,plname);
      }
      else {
        pcVar16 = doname(level->objects[u.ux][u.uy]);
        pline("Wait, %s!  There\'s a %s named %s hiding under %s!",pcVar14,pcVar15,plname,pcVar16);
      }
      if (poVar13 != (obj *)0x0) {
        poVar13->spe = sVar2;
      }
    }
    else {
      pline("It tries to move where you are hiding.");
    }
LAB_001cbb6f:
    newsym((int)u.ux,(int)u.uy);
    return 0;
  }
  if ((((youmonst.m_ap_type != '\0' && cVar18 == '\0') && (youmonst.data)->mlet == '\r') &&
      (cVar22 != '\0')) && ((u._1052_1_ & 1) == 0)) {
    if (bVar20 == 0) {
      pcVar14 = m_monnam(mtmp);
      pcVar15 = mons_mname(youmonst.data);
      pline("Wait, %s!  That\'s a %s named %s!",pcVar14,pcVar15,plname);
    }
    else {
      pline("It gets stuck on you.");
    }
    youmonst.m_ap_type = '\0';
    youmonst.mappearance = 0;
    u.ustuck = mtmp;
    goto LAB_001cbb6f;
  }
  if (((youmonst.m_ap_type == '\x02' && cVar18 == '\0') && (cVar22 != '\0')) &&
     ((u._1052_1_ & 1) == 0)) {
    if (bVar20 == 0) {
      pcVar14 = m_monnam(mtmp);
      pcVar15 = mimic_obj_name(&youmonst);
      pcVar16 = mons_mname(mons + u.umonnum);
      pcVar16 = an(pcVar16);
      pline("Wait, %s!  That %s is really %s named %s!",pcVar14,pcVar15,pcVar16,plname);
    }
    else {
      pcVar14 = "tries to pick you up";
      if (youmonst.mappearance != 0x1ef) {
        pcVar14 = "disturbs you";
      }
      if ((mtmp->data->mflags2 & 0x10000000) == 0) {
        pcVar14 = "disturbs you";
      }
      pline("Something %s!",pcVar14);
    }
    if (multi < 0) {
      if (u.umonnum == u.umonster) {
        pcVar14 = "yourself";
      }
      else {
        pcVar14 = mons_mname(youmonst.data);
        pcVar14 = an(pcVar14);
      }
      sprintf((char *)local_138,"You appear to be %s again.",pcVar14);
      unmul((char *)local_138);
      return 0;
    }
    return 0;
  }
  uVar11 = (uint)u.uac;
  if (u.uac < '\0') {
    uVar10 = mt_random();
    uVar11 = ~(uVar10 % -uVar11);
  }
  iVar9 = mtmp->m_lev + uVar11 + 10 + (multi >> 0x1f) * -4;
  if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
         (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
       (u.uprops[0xd].blocked == 0)) && ((local_278->mflags1 & 0x1000000) == 0)) ||
     ((mtmp->field_0x62 & 2) == 0)) {
    iVar9 = iVar9 + -2;
  }
  uVar11 = *(uint *)&mtmp->field_0x60;
  iVar21 = iVar9 + -2;
  if ((uVar11 >> 0x17 & 1) == 0) {
    iVar21 = iVar9;
  }
  local_27c = 1;
  if (1 < iVar21) {
    local_27c = iVar21;
  }
  if ((uVar11 & 2) != 0 && local_278->mlet == '9') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      *(uint *)&mtmp->field_0x60 = uVar11 & 0xfffffffd;
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
  }
  uVar11 = *(uint *)&mtmp->field_0x60;
  if ((((uVar11 & 0x70) == 0) && ((local_278->mflags2 & 0x200) != 0 && cVar18 == '\0')) &&
     (ppVar5 = mtmp->data,
     ppVar5 != mons + 0x130 && (ppVar5 != mons + 0x12f && ppVar5 != mons + 0x13a))) {
    if (uwep == (obj *)0x0) {
      if ((uVar11 >> 8 & 1) == 0) goto LAB_001cbe43;
    }
    else if (((uVar11 >> 8 & 1) == 0) && (uwep->oartifact != '\x0e')) {
LAB_001cbe43:
      uVar11 = mt_random();
      if (uVar11 * -0x3b13b13b < 0x13b13b14) {
        msummon(mtmp,&mtmp->dlevel->z);
      }
    }
  }
  if (((mtmp->field_0x60 & 0x70) != 0) || ((local_278->mflags2 & 4) == 0 || cVar18 != '\0'))
  goto LAB_001cc049;
  if ((local_278->mflags2 & 8) == 0) {
    uVar11 = mt_random();
    if ((uVar11 * -0x11111111 >> 1 | (uint)((uVar11 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889) {
LAB_001cbecd:
      if ((mtmp->field_0x61 & 1) == 0) {
        new_were(mtmp);
      }
    }
  }
  else {
    iVar9 = night();
    uVar11 = mt_random();
    if (SUB168(ZEXT416(uVar11) % SEXT816((long)(iVar9 * -2 + 5)),0) == 0) goto LAB_001cbecd;
  }
  local_278 = mtmp->data;
  uVar11 = mt_random();
  if ((0x19999999 < (uVar11 * -0x33333333 >> 1 | (uint)((uVar11 * -0x33333333 & 1) != 0) << 0x1f))
     || ((mtmp->field_0x61 & 1) != 0)) goto LAB_001cc049;
  local_238[0] = 0x61657263;
  local_238[1] = 0x65727574;
  local_230 = 0;
  iVar9 = were_summon(local_278,'\0',(int *)&local_26c,(char *)local_238);
  if (bVar20 == 0) {
    pcVar14 = Monnam(mtmp);
    pline("%s summons help!",pcVar14);
    if (iVar9 < 1) {
      pline("But none comes.");
      goto LAB_001cc049;
    }
    if (local_26c != (attack)0x0) goto LAB_001cc049;
  }
  else {
    if (flags.soundok == '\0') {
      pcVar14 = " from nowhere";
    }
    else {
      pcVar14 = growl_sound(mtmp);
      pcVar14 = makeplural(pcVar14);
      pline("Something %s!",pcVar14);
      pcVar14 = "";
    }
    if (iVar9 < 1) goto LAB_001cc049;
    if (0 < (int)local_26c) {
      local_268 = pcVar14;
      if (local_26c == (attack)0x1) {
        pcVar14 = an((char *)local_238);
        pcVar15 = "%s appears";
      }
      else {
        pcVar14 = makeplural((char *)local_238);
        pcVar15 = "%s appear";
      }
      sprintf((char *)local_138,pcVar15,pcVar14);
      pcVar14 = upstart((char *)local_138);
      pline("%s%s!",pcVar14,local_268);
      goto LAB_001cc049;
    }
  }
  pline("You feel hemmed in.");
LAB_001cc049:
  if ((u._1052_1_ & 0x10) != 0) {
    if (u.ustuck == mtmp) {
      pcVar14 = Monnam(mtmp);
      pcVar15 = "%s loosens its grip slightly.";
    }
    else {
      if (cVar18 != '\0') {
        return 0;
      }
      if ((bVar20 != 0) &&
         (((((mtmp->data->mflags1 & 0x10000) != 0 ||
            ((poVar13 = which_armor(mtmp,4), poVar13 != (obj *)0x0 &&
             (poVar13 = which_armor(mtmp,4), poVar13->otyp == 0x4f)))) ||
           ((((u.uprops[0x1e].intrinsic == 0 &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
              ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
            (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
             (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar9)))))) &&
          (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
           (bVar8 = match_warn_of_mon(mtmp), bVar8 == '\0')))))) {
        pline("You feel something move nearby.");
        return 0;
      }
      pcVar14 = Monnam(mtmp);
      pcVar15 = "%s starts to attack you, but pulls back.";
    }
    pline(pcVar15,pcVar14);
    return 0;
  }
  local_268 = (char *)CONCAT44(local_268._4_4_,uVar19);
  local_138[0].misc = (obj *)0x0;
  local_138[0].has_offense = MUSE_NONE;
  local_138[0].has_defense = MUSE_NONE;
  local_138[0].offensive = (obj *)0x0;
  local_138[0].defensive = (obj *)0x0;
  local_138[0].has_misc = MUSE_NONE;
  local_138[0]._36_4_ = 0;
  bVar8 = find_offensive(mtmp,local_138);
  if (bVar8 != '\0') {
    iVar9 = use_offensive(mtmp,local_138);
    if (iVar9 != 0) {
      return (uint)(iVar9 == 1);
    }
  }
  lVar17 = 0x10;
  local_248 = &u.uz;
  local_250 = &dungeon_topology.d_rogue_level;
  local_258 = uVar12;
  local_254 = uVar12 & 0xff;
  local_240 = mons + 0x127;
  uVar24 = 0;
  do {
    local_238[uVar24] = 0;
    mattk = (attack *)((long)&((permonst *)(local_278->mattk + -4))->mname + lVar17);
    if ((uVar24 != 0) && (0 < *(int *)((long)&local_240 + uVar24 * 4 + 4))) {
      bVar3 = local_278->mattk[uVar24].adtyp;
      if (((ulong)bVar3 < 0x28) &&
         (((0xc200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0 &&
          (bVar3 == local_278->mattk[uVar24 - 1].adtyp)))) {
        local_26c._2_2_ = SUB42(local_278->mattk[uVar24],2);
        local_26c.aatyp = local_278->mattk[uVar24].aatyp;
        local_26c.adtyp = '\f';
        mattk = &local_26c;
      }
    }
    if (((u._1052_1_ & 1) == 0) || (mattk->aatyp == '\v')) {
      uVar4 = mattk->aatyp;
      iVar9 = (int)uVar24;
      switch(uVar4) {
      case '\x01':
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\x10':
        if (((char)local_268 == '\0') &&
           (((mtmp->mw == (obj *)0x0 || ((mtmp->field_0x62 & 0x20) != 0)) ||
            ((u.uprops[0x15].intrinsic != 0 ||
             ((u.uprops[0x15].extrinsic != 0 ||
              (youmonst.data != mons + 0xb && youmonst.data != mons + 0xc)))))))) {
          if ((char)local_258 == '\0') {
LAB_001cc4ed:
            wildmiss(mtmp,mattk);
          }
          else {
            uVar12 = mt_random();
            iVar9 = uVar12 % (iVar9 + 0x14U) + 1;
            if (iVar9 < local_27c) {
              if ((mattk->aatyp != '\x03') || (((youmonst.data)->mflags1 & 0x200000) == 0))
              goto LAB_001cc418;
            }
            else {
LAB_001cc39d:
              missmu(mtmp,local_27c == iVar9,mattk);
            }
          }
        }
        break;
      case '\a':
        if ((((1 < uVar24 && (char)local_268 == '\0') &&
             (*(int *)((long)&local_240 + uVar24 * 4 + 4) != 0)) &&
            (*(int *)((long)&local_240 + uVar24 * 4) != 0)) || (u.ustuck == mtmp)) {
LAB_001cc418:
          iVar9 = hitmu(mtmp,mattk);
LAB_001cc50e:
          local_238[uVar24] = iVar9;
        }
        break;
      case '\b':
      case '\t':
      case '\x0e':
        break;
      case '\n':
        if ((char)local_268 != '\0') {
          iVar9 = spitmu(mtmp,mattk);
          goto LAB_001cc50e;
        }
        break;
      case '\v':
        if ((char)local_268 == '\0') {
          if ((char)local_258 != '\0') {
            if ((u._1052_1_ & 1) == 0) {
              uVar12 = mt_random();
              iVar9 = uVar12 % (iVar9 + 0x14U) + 1;
              if (local_27c <= iVar9) goto LAB_001cc39d;
            }
            flush_screen();
            iVar9 = gulpmu(mtmp,mattk);
            goto LAB_001cc50e;
          }
          ppVar5 = mtmp->data;
          if ((ppVar5->mflags1 & 0x40000) == 0) {
            if (bVar20 != 0) {
              pcVar14 = "splat";
              if (ppVar5 == mons + 0x9f) {
                pcVar14 = "rushing noise";
              }
              if (ppVar5->mlet == '\x16') {
                pcVar14 = "rushing noise";
              }
              You_hear("a %s nearby.",pcVar14);
              break;
            }
            pcVar14 = Monnam(mtmp);
            pcVar15 = "%s lunges forward and recoils!";
          }
          else {
            pcVar14 = Monnam(mtmp);
            pcVar15 = "%s gulps some air!";
          }
          pline(pcVar15,pcVar14);
        }
        break;
      case '\f':
        if ((char)local_268 != '\0') {
          iVar9 = breamu(mtmp,mattk);
          goto LAB_001cc50e;
        }
        break;
      case '\r':
        if ((char)local_268 == '\0') {
          iVar9 = explmu(mtmp,mattk,(boolean)local_254);
          goto LAB_001cc50e;
        }
        break;
      case '\x0f':
        if (local_278 != local_240) {
          iVar9 = gazemu(mtmp,mattk);
          goto LAB_001cc50e;
        }
        break;
      default:
        if (uVar4 == 0xfe) {
          if ((char)local_268 == '\0') {
            if ((mtmp->weapon_check == '\x01') || (mtmp->mw == (obj *)0x0)) {
              mtmp->weapon_check = '\x03';
              iVar21 = mon_wield_item(mtmp);
              if (iVar21 != 0) break;
            }
            if ((char)local_258 == '\0') goto LAB_001cc4ed;
            otmp = mtmp->mw;
            if (otmp == (obj *)0x0) {
              local_25c = 0;
            }
            else {
              local_25c = hitval(otmp,&youmonst);
              local_27c = local_27c + local_25c;
              mswings(mtmp,otmp);
            }
            uVar12 = mt_random();
            dieroll = uVar12 % (iVar9 + 0x14U) + 1;
            if (dieroll < local_27c) {
              iVar9 = hitmu(mtmp,mattk);
              local_238[uVar24] = iVar9;
            }
            else {
              missmu(mtmp,local_27c == dieroll,mattk);
            }
            uVar12 = local_25c;
            if (otmp == (obj *)0x0) {
              uVar12 = 0;
            }
            local_27c = local_27c - uVar12;
          }
          else {
            bVar8 = on_level(local_248,local_250);
            if (bVar8 == '\0') {
              thrwmu(mtmp);
            }
          }
        }
        else if (uVar4 == 0xff) {
          if ((char)local_268 == '\0') {
            iVar9 = castmu(mtmp,mattk,'\x01',(boolean)local_254);
          }
          else {
            iVar9 = buzzmu(mtmp,mattk);
          }
          goto LAB_001cc50e;
        }
      }
      if (iflags.botl != '\0') {
        bot();
      }
      iVar9 = local_238[uVar24];
      if (((iVar9 == 1) && (u.usleep != 0)) && ((uint)u.usleep < moves)) {
        if ((((u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) &&
             (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) ||
           ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0 &&
             ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
            ((((byte)youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))))) {
          local_25c = 10;
          if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
              ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
             (((byte)youmonst.mintrinsics & 4) == 0)) {
            local_25c = (uint)(u.uprops[0x38].extrinsic != 0) * 5 + 5;
          }
          uVar12 = mt_random();
          if (uVar12 % local_25c != 0) goto LAB_001cc60c;
        }
        multi = -1;
        nomovemsg = "The combat suddenly awakens you.";
      }
LAB_001cc60c:
      if (iVar9 == 2) {
        return 1;
      }
      if (iVar9 == 3) {
        return 0;
      }
    }
    uVar24 = uVar24 + 1;
    lVar17 = lVar17 + 4;
    if (uVar24 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

int mattacku(struct monst *mtmp)
{
	const struct attack *mattk;
	struct attack alt_attk;
	int	i, j, tmp, sum[NATTK];
	struct musable musable;
	
	const struct permonst *mdat = mtmp->data;
	boolean ranged = (distu(mtmp->mx, mtmp->my) > 3);
		/* Is it near you?  Affects your actions */
	boolean range2 = !monnear(mtmp, mtmp->mux, mtmp->muy);
		/* Does it think it's near you?  Affects its actions */
	boolean foundyou = (mtmp->mux==u.ux && mtmp->muy==u.uy);
		/* Is it attacking you or your image? */
	boolean youseeit = canseemon(level, mtmp);
		/* Might be attacking your image around the corner, or
		 * invisible, or you might be blind....
		 */
	
	if (!ranged) nomul(0, NULL);
	if (mtmp->mhp <= 0 || (Underwater && !is_swimmer(mtmp->data)))
	    return 0;

	/* If swallowed, can only be affected by u.ustuck */
	if (u.uswallow) {
	    if (mtmp != u.ustuck)
		return 0;
	    u.ustuck->mux = u.ux;
	    u.ustuck->muy = u.uy;
	    range2 = 0;
	    foundyou = 1;
	    if (u.uinvulnerable) return 0; /* stomachs can't hurt you! */
	}

	else if (u.usteed) {
		if (mtmp == u.usteed)
			/* Your steed won't attack you */
			return 0;
		/* Orcs like to steal and eat horses and the like */
		if (!rn2(is_orc(mtmp->data) ? 2 : 4) &&
				distu(mtmp->mx, mtmp->my) <= 2) {
			/* Attack your steed instead */
			i = mattackm(mtmp, u.usteed);
			if ((i & MM_AGR_DIED))
				return 1;
			if (i & MM_DEF_DIED || u.umoved)
				return 0;
			/* Let your steed retaliate */
			return !!(mattackm(u.usteed, mtmp) & MM_DEF_DIED);
		}
	}

	if (u.uundetected && !range2 && foundyou && !u.uswallow) {
		u.uundetected = 0;
		if (is_hider(youmonst.data)) {
		    coord cc; /* maybe we need a unexto() function? */
		    struct obj *obj;

		    pline("You fall from the %s!", ceiling(u.ux,u.uy));
		    if (enexto(&cc, level, u.ux, u.uy, youmonst.data)) {
			remove_monster(level, mtmp->mx, mtmp->my);
			newsym(mtmp->mx,mtmp->my);
			place_monster(mtmp, u.ux, u.uy);
			if (mtmp->wormno) worm_move(mtmp);
			teleds(cc.x, cc.y, TRUE);
			set_apparxy(level, mtmp);
			newsym(u.ux,u.uy);
		    } else {
			pline("%s is killed by a falling %s (you)!",
					Monnam(mtmp), mons_mname(youmonst.data));
			killed(mtmp);
			newsym(u.ux,u.uy);
			if (mtmp->mhp > 0) return 0;
			else return 1;
		    }
		    if (youmonst.data->mlet != S_PIERCER)
			return 0;	/* trappers don't attack */

		    obj = which_armor(mtmp, WORN_HELMET);
		    if (obj && is_metallic(obj)) {
			pline("Your blow glances off %s helmet.",
			               s_suffix(mon_nam(mtmp)));
		    } else {
			if (3 + find_mac(mtmp) <= rnd(20)) {
			    pline("%s is hit by a falling piercer (you)!",
								Monnam(mtmp));
			    if ((mtmp->mhp -= dice(3,6)) < 1)
				killed(mtmp);
			} else
			  pline("%s is almost hit by a falling piercer (you)!",
								Monnam(mtmp));
		    }
		} else {
		    if (!youseeit)
			pline("It tries to move where you are hiding.");
		    else {
			/* Ugly kludge for eggs.  The message is phrased so as
			 * to be directed at the monster, not the player,
			 * which makes "laid by you" wrong.  For the
			 * parallelism to work, we can't rephrase it, so we
			 * zap the "laid by you" momentarily instead.
			 */
			struct obj *obj = level->objects[u.ux][u.uy];

			if (obj ||
			      (youmonst.data->mlet == S_EEL && is_pool(level, u.ux, u.uy))) {
			    int save_spe = 0; /* suppress warning */
			    if (obj) {
				save_spe = obj->spe;
				if (obj->otyp == EGG) obj->spe = 0;
			    }
			    if (youmonst.data->mlet == S_EEL)
		pline("Wait, %s!  There's a hidden %s named %s there!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname);
			    else
	     pline("Wait, %s!  There's a %s named %s hiding under %s!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname,
				doname(level->objects[u.ux][u.uy]));
			    if (obj) obj->spe = save_spe;
			} else
			    warning("hiding under nothing?");
		    }
		    newsym(u.ux,u.uy);
		}
		return 0;
	}
	if (youmonst.data->mlet == S_MIMIC && youmonst.m_ap_type &&
		    !range2 && foundyou && !u.uswallow) {
		if (!youseeit) pline("It gets stuck on you.");
		else pline("Wait, %s!  That's a %s named %s!",
			   m_monnam(mtmp), mons_mname(youmonst.data), plname);
		u.ustuck = mtmp;
		youmonst.m_ap_type = M_AP_NOTHING;
		youmonst.mappearance = 0;
		newsym(u.ux,u.uy);
		return 0;
	}

	/* player might be mimicking an object */
	if (youmonst.m_ap_type == M_AP_OBJECT && !range2 && foundyou && !u.uswallow) {
	    if (!youseeit)
		 pline("Something %s!",
			(likes_gold(mtmp->data) && youmonst.mappearance == GOLD_PIECE) ?
			"tries to pick you up" : "disturbs you");
	    else pline("Wait, %s!  That %s is really %s named %s!",
			m_monnam(mtmp),
			mimic_obj_name(&youmonst),
			an(mons_mname(&mons[u.umonnum])),
			plname);
	    if (multi < 0) {	/* this should always be the case */
		char buf[BUFSZ];
		sprintf(buf, "You appear to be %s again.",
			Upolyd ? (const char *) an(mons_mname(youmonst.data)) :
			    (const char *) "yourself");
		unmul(buf);	/* immediately stop mimicking */
	    }
	    return 0;
	}

/*	Work out the armor class differential	*/
	tmp = AC_VALUE(u.uac) + 10;		/* tmp ~= 0 - 20 */
	tmp += mtmp->m_lev;
	if (multi < 0) tmp += 4;
	if ((Invis && !perceives(mdat)) || !mtmp->mcansee)
		tmp -= 2;
	if (mtmp->mtrapped) tmp -= 2;
	if (tmp <= 0) tmp = 1;

	/* make eels visible the moment they hit/miss us */
	if (mdat->mlet == S_EEL && mtmp->minvis && cansee(mtmp->mx,mtmp->my)) {
		mtmp->minvis = 0;
		newsym(mtmp->mx,mtmp->my);
	}

/*	Special demon handling code */
	if (!mtmp->cham && is_demon(mdat) && !range2
	   && mtmp->data != &mons[PM_BALROG]
	   && mtmp->data != &mons[PM_SUCCUBUS]
	   && mtmp->data != &mons[PM_INCUBUS]
	   && (!uwep || uwep->oartifact != ART_DEMONBANE))
	    if (!mtmp->mcan && !rn2(13))	msummon(mtmp, &mtmp->dlevel->z);

/*	Special lycanthrope handling code */
	if (!mtmp->cham && is_were(mdat) && !range2) {

	    if (is_human(mdat)) {
		if (!rn2(5 - (night() * 2)) && !mtmp->mcan) new_were(mtmp);
	    } else if (!rn2(30) && !mtmp->mcan) new_were(mtmp);
	    mdat = mtmp->data;

	    if (!rn2(10) && !mtmp->mcan) {
	    	int numseen, numhelp;
		char buf[BUFSZ], genericwere[BUFSZ];

		strcpy(genericwere, "creature");
		numhelp = were_summon(mdat, FALSE, &numseen, genericwere);
		if (youseeit) {
			pline("%s summons help!", Monnam(mtmp));
			if (numhelp > 0) {
			    if (numseen == 0)
				pline("You feel hemmed in.");
			} else pline("But none comes.");
		} else {
			const char *from_nowhere;

			if (flags.soundok) {
				pline("Something %s!",
					makeplural(growl_sound(mtmp)));
				from_nowhere = "";
			} else from_nowhere = " from nowhere";
			if (numhelp > 0) {
			    if (numseen < 1) pline("You feel hemmed in.");
			    else {
				if (numseen == 1)
			    		sprintf(buf, "%s appears",
							an(genericwere));
			    	else
			    		sprintf(buf, "%s appear",
							makeplural(genericwere));
				pline("%s%s!", upstart(buf), from_nowhere);
			    }
			} /* else no help came; but you didn't know it tried */
		}
	    }
	}

	if (u.uinvulnerable) {
	    /* monsters won't attack you */
	    if (mtmp == u.ustuck)
		pline("%s loosens its grip slightly.", Monnam(mtmp));
	    else if (!range2) {
		if (youseeit || sensemon(mtmp))
		    pline("%s starts to attack you, but pulls back.",
			  Monnam(mtmp));
		else
		    pline("You feel something move nearby.");
	    }
	    return 0;
	}

	/* Unlike defensive stuff, don't let them use item _and_ attack. */
	memset(&musable, 0, sizeof(musable));
	if (find_offensive(mtmp, &musable)) {
		int foo = use_offensive(mtmp, &musable);

		if (foo != 0) return foo==1;
	}

	for (i = 0; i < NATTK; i++) {

	    sum[i] = 0;
	    mattk = getmattk(mdat, i, sum, &alt_attk);
	    if (u.uswallow && (mattk->aatyp != AT_ENGL))
		continue;
	    switch(mattk->aatyp) {
		case AT_CLAW:	/* "hand to hand" attacks */
		case AT_KICK:
		case AT_BITE:
		case AT_STNG:
		case AT_TUCH:
		case AT_BUTT:
		case AT_TENT:
			if (!range2 && (!MON_WEP(mtmp) || mtmp->mconf || Conflict ||
					!touch_petrifies(youmonst.data))) {
			    if (foundyou) {
				if (tmp > (j = rnd(20+i))) {
				    if (mattk->aatyp != AT_KICK ||
					    !thick_skinned(youmonst.data))
					sum[i] = hitmu(mtmp, mattk);
				} else
				    missmu(mtmp, (tmp == j), mattk);
			    } else
				wildmiss(mtmp, mattk);
			}
			break;

		case AT_HUGS:	/* automatic if prev two attacks succeed */
			/* Note: if displaced, prev attacks never succeeded */
			if ((!range2 && i>=2 && sum[i-1] && sum[i-2])
							|| mtmp == u.ustuck)
				sum[i]= hitmu(mtmp, mattk);
			break;

		case AT_GAZE:	/* can affect you either ranged or not */
			/* Medusa gaze already operated through m_respond in
			 * dochug(); don't gaze more than once per round.
			 */
			if (mdat != &mons[PM_MEDUSA])
				sum[i] = gazemu(mtmp, mattk);
			break;

		case AT_EXPL:	/* automatic hit if next to, and aimed at you */
			if (!range2) sum[i] = explmu(mtmp, mattk, foundyou);
			break;

		case AT_ENGL:
			if (!range2) {
			    if (foundyou) {
				if (u.uswallow || tmp > (j = rnd(20+i))) {
				    /* Force swallowing monster to be
				     * displayed even when player is
				     * moving away */
				    flush_screen();
				    sum[i] = gulpmu(mtmp, mattk);
				} else {
				    missmu(mtmp, (tmp == j), mattk);
				}
			    } else if (is_animal(mtmp->data)) {
				pline("%s gulps some air!", Monnam(mtmp));
			    } else {
				if (youseeit)
				    pline("%s lunges forward and recoils!",
					  Monnam(mtmp));
				else
				    You_hear("a %s nearby.",
					     is_whirly(mtmp->data) ?
						"rushing noise" : "splat");
			   }
			}
			break;
		case AT_BREA:
			if (range2) sum[i] = breamu(mtmp, mattk);
			/* Note: breamu takes care of displacement */
			break;
		case AT_SPIT:
			if (range2) sum[i] = spitmu(mtmp, mattk);
			/* Note: spitmu takes care of displacement */
			break;
		case AT_WEAP:
			if (range2) {
				if (!Is_rogue_level(&u.uz))
					thrwmu(mtmp);
			} else {
			    int hittmp = 0;

			    /* Rare but not impossible.  Normally the monster
			     * wields when 2 spaces away, but it can be
			     * teleported or whatever....
			     */
			    if (mtmp->weapon_check == NEED_WEAPON ||
							!MON_WEP(mtmp)) {
				mtmp->weapon_check = NEED_HTH_WEAPON;
				/* mon_wield_item resets weapon_check as
				 * appropriate */
				if (mon_wield_item(mtmp) != 0) break;
			    }
			    if (foundyou) {
				otmp = MON_WEP(mtmp);
				if (otmp) {
				    hittmp = hitval(otmp, &youmonst);
				    tmp += hittmp;
				    mswings(mtmp, otmp);
				}
				if (tmp > (j = dieroll = rnd(20+i)))
				    sum[i] = hitmu(mtmp, mattk);
				else
				    missmu(mtmp, (tmp == j), mattk);
				/* KMH -- Don't accumulate to-hit bonuses */
				if (otmp)
					tmp -= hittmp;
			    } else
				wildmiss(mtmp, mattk);
			}
			break;
		case AT_MAGC:
			if (range2)
			    sum[i] = buzzmu(mtmp, mattk);
			else
			    sum[i] = castmu(mtmp, mattk, TRUE, foundyou);
			break;

		default:		/* no attack */
			break;
	    }
	    if (iflags.botl) bot();
	/* give player a chance of waking up before dying -kaa */
	    if (sum[i] == 1) {	    /* successful attack */
		if (u.usleep && u.usleep < moves &&
		    (FSleep_resistance || !rn2(PSleep_resistance ? 5 : 10))) {
		    multi = -1;
		    nomovemsg = "The combat suddenly awakens you.";
		}
	    }
	    if (sum[i] == 2) return 1;		/* attacker dead */
	    if (sum[i] == 3) break;  /* attacker teleported, no more attacks */
	    /* sum[i] == 0: unsuccessful attack */
	}
	return 0;
}